

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O0

void __thiscall Farm::createTruck(Farm *this)

{
  bool bVar1;
  ostream *this_00;
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  Truck local_108;
  allocator local_d9;
  string local_d8 [32];
  uint local_b8;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  string local_68 [48];
  double local_38;
  double capacity;
  string plate;
  Farm *this_local;
  
  std::__cxx11::string::string((string *)&capacity);
  std::operator<<((ostream *)&std::cout,"Enter new truck\'s plate: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&capacity);
  std::__cxx11::string::string(local_68,(string *)&capacity);
  bVar1 = searchTruckByPlate(this,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"ERROR: It already exists a truck with the given plate!",&local_89);
    cinERR((string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"ENTER to go back",&local_b1);
    enterWait((string *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Enter truck\'s capacity: ",&local_d9);
    getDouble(&local_38,(string *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::string(local_128,(string *)&capacity);
    Truck::Truck(&local_108,local_38,(string *)local_128);
    addTruck(this,&local_108);
    Truck::~Truck(&local_108);
    std::__cxx11::string::~string(local_128);
    this->farmFileChanged = true;
    this_00 = std::operator<<((ostream *)&std::cout,"Truck successfully created!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"ENTER to go back",&local_149);
    enterWait((string *)local_148);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  local_b8 = (uint)bVar1;
  std::__cxx11::string::~string((string *)&capacity);
  return;
}

Assistant:

void Farm::createTruck() {
    string plate;
    double capacity;

    cout << "Enter new truck's plate: ";
    getline(cin, plate);
    if(searchTruckByPlate(plate)){
        cinERR("ERROR: It already exists a truck with the given plate!");
        enterWait();
        return;
    }

    getDouble(capacity, "Enter truck's capacity: ");

    addTruck(Truck(capacity, plate));

    farmFileChanged = true;
    cout << "Truck successfully created!" << endl;
    enterWait();
}